

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccnr.cc
# Opt level: O3

void __thiscall CCNR::ls_solver::initialize_variable_datas(ls_solver *this)

{
  pointer pvVar1;
  pointer pcVar2;
  pointer plVar3;
  pointer pcVar4;
  long lVar5;
  iterator __position;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 in_RAX;
  ulong uVar8;
  undefined1 uVar9;
  longlong *plVar10;
  ulong uVar11;
  pointer plVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined8 uStack_38;
  
  uVar8 = this->_num_vars;
  if (uVar8 != 0) {
    pvVar1 = (this->_vars).super__Vector_base<CCNR::variable,_std::allocator<CCNR::variable>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pcVar2 = (this->_clauses).super__Vector_base<CCNR::clause,_std::allocator<CCNR::clause>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar13 = 2;
    if (2 < uVar8 + 1) {
      uVar13 = uVar8 + 1;
    }
    uVar11 = 1;
    do {
      pvVar1[uVar11].score = 0;
      plVar12 = *(pointer *)
                 &pvVar1[uVar11].literals.super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>.
                  _M_impl;
      plVar3 = *(pointer *)
                ((long)&pvVar1[uVar11].literals.
                        super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>._M_impl + 8);
      if (plVar12 != plVar3) {
        pcVar4 = (this->_solution).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar14 = 0;
        do {
          iVar15 = (int)*(uint *)plVar12 >> 1;
          if (pcVar2[iVar15].sat_count == 1) {
            if ((*(uint *)plVar12 & 1) == (int)pcVar4[plVar12->var_num]) {
              lVar5 = -pcVar2[iVar15].weight;
              goto LAB_0012d250;
            }
          }
          else if (pcVar2[iVar15].sat_count == 0) {
            lVar5 = pcVar2[iVar15].weight;
LAB_0012d250:
            lVar14 = lVar14 + lVar5;
            pvVar1[uVar11].score = lVar14;
          }
          plVar12 = plVar12 + 1;
        } while (plVar12 != plVar3);
      }
      auVar7 = _DAT_0012f060;
      auVar6 = _DAT_0012f020;
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar13);
    if (uVar8 != 0) {
      lVar14 = uVar13 - 2;
      auVar16._8_4_ = (int)lVar14;
      auVar16._0_8_ = lVar14;
      auVar16._12_4_ = (int)((ulong)lVar14 >> 0x20);
      plVar10 = &(this->_vars).super__Vector_base<CCNR::variable,_std::allocator<CCNR::variable>_>.
                 _M_impl.super__Vector_impl_data._M_start[2].last_flip_step;
      uVar11 = 0;
      auVar16 = auVar16 ^ _DAT_0012f060;
      do {
        auVar17._8_4_ = (int)uVar11;
        auVar17._0_8_ = uVar11;
        auVar17._12_4_ = (int)(uVar11 >> 0x20);
        auVar17 = (auVar17 | auVar6) ^ auVar7;
        if ((bool)(~(auVar17._4_4_ == auVar16._4_4_ && auVar16._0_4_ < auVar17._0_4_ ||
                    auVar16._4_4_ < auVar17._4_4_) & 1)) {
          plVar10[-9] = 0;
        }
        if ((auVar17._12_4_ != auVar16._12_4_ || auVar17._8_4_ <= auVar16._8_4_) &&
            auVar17._12_4_ <= auVar16._12_4_) {
          *plVar10 = 0;
        }
        uVar11 = uVar11 + 2;
        plVar10 = plVar10 + 0x12;
      } while ((uVar13 & 0xfffffffffffffffe) != uVar11);
      if (uVar8 != 0) {
        uVar13 = 1;
        lVar14 = 0x8d;
        uStack_38 = in_RAX;
        do {
          pvVar1 = (this->_vars).super__Vector_base<CCNR::variable,_std::allocator<CCNR::variable>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(undefined1 *)((long)pvVar1 + lVar14 + -1) = 1;
          if (*(long *)((long)pvVar1 + lVar14 + -0x15) < 1) {
            uVar9 = 0;
          }
          else {
            uStack_38 = CONCAT44((int)uVar13,(undefined4)uStack_38);
            __position._M_current =
                 (this->_ccd_vars).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (this->_ccd_vars).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (&this->_ccd_vars,__position,(int *)((long)&uStack_38 + 4));
              uVar8 = this->_num_vars;
            }
            else {
              *__position._M_current = (int)uVar13;
              (this->_ccd_vars).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            uVar9 = 1;
          }
          *(undefined1 *)
           ((long)&(pvVar1->literals).super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>.
                   _M_impl + lVar14) = uVar9;
          uVar13 = uVar13 + 1;
          lVar14 = lVar14 + 0x48;
        } while (uVar13 <= uVar8);
      }
    }
  }
  pvVar1 = (this->_vars).super__Vector_base<CCNR::variable,_std::allocator<CCNR::variable>_>._M_impl
           .super__Vector_impl_data._M_start;
  pvVar1->cc_value = false;
  pvVar1->is_in_ccd_vars = false;
  pvVar1->score = 0;
  pvVar1->last_flip_step = 0;
  return;
}

Assistant:

void ls_solver::initialize_variable_datas()
{
    size_t v, c;
    variable *vp;
    // scores
    for (v = 1; v <= _num_vars; v++) {
        vp = &(_vars[v]);
        vp->score = 0;
        for (lit l : vp->literals) {
            c = l.clause_num;
            if (0 == _clauses[c].sat_count) {
                vp->score += _clauses[c].weight;
            } else if (1 == _clauses[c].sat_count && l.sense == _solution[l.var_num]) {
                vp->score -= _clauses[c].weight;
            }
        }
    }
    // last flip step
    for (v = 1; v <= _num_vars; v++) {
        _vars[v].last_flip_step = 0;
    }
    // cc datas
    for (v = 1; v <= _num_vars; v++) {
        vp = &(_vars[v]);
        vp->cc_value = 1;
        if (vp->score > 0) //&&_vars[v].cc_value==1
        {
            _ccd_vars.push_back(v);
            vp->is_in_ccd_vars = 1;
        } else {
            vp->is_in_ccd_vars = 0;
        }
    }
    // the virtual var 0
    vp = &(_vars[0]);
    vp->score = 0;
    vp->cc_value = 0;
    vp->is_in_ccd_vars = 0;
    vp->last_flip_step = 0;
}